

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscopy.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int status;
  fitsfile *outfptr;
  fitsfile *infptr;
  
  status = 0;
  if (argc == 3) {
    iVar1 = ffopentest(10,&infptr,argv[1],0,&status);
    if (iVar1 == 0) {
      iVar1 = ffinit(&outfptr,argv[2],&status);
      if (iVar1 == 0) {
        ffcpfl(infptr,outfptr,1,1,1,&status);
        ffclos(outfptr,&status);
      }
      ffclos(infptr,&status);
    }
    iVar1 = 0;
    if (status != 0) {
      ffrprt(_stderr);
      iVar1 = status;
    }
  }
  else {
    puts("Usage:  fitscopy inputfile outputfile");
    putchar(10);
    puts("Copy an input file to an output file, optionally filtering");
    puts("the file in the process.  This seemingly simple program can");
    puts("apply powerful filters which transform the input file as");
    puts("it is being copied.  Filters may be used to extract a");
    puts("subimage from a larger image, select rows from a table,");
    puts("filter a table with a GTI time extension or a SAO region file,");
    puts("create or delete columns in a table, create an image by");
    puts("binning (histogramming) 2 table columns, and convert IRAF");
    puts("format *.imh or raw binary data files into FITS images.");
    puts("See the CFITSIO User\'s Guide for a complete description of");
    puts("the Extended File Name filtering syntax.");
    putchar(10);
    puts("Examples:");
    putchar(10);
    puts("fitscopy in.fit out.fit                   (simple file copy)");
    puts("fitscopy - -                              (stdin to stdout)");
    puts("fitscopy in.fit[11:50,21:60] out.fit      (copy a subimage)");
    puts("fitscopy iniraf.imh out.fit               (IRAF image to FITS)");
    puts("fitscopy in.dat[i512,512] out.fit         (raw array to FITS)");
    puts("fitscopy in.fit[events][pi>35] out.fit    (copy rows with pi>35)");
    puts("fitscopy in.fit[events][bin X,Y] out.fit  (bin an image) ");
    puts("fitscopy in.fit[events][col x=.9*y] out.fit        (new x column)");
    puts("fitscopy in.fit[events][gtifilter()] out.fit       (time filter)");
    puts("fitscopy in.fit[2][regfilter(\"pow.reg\")] out.fit (spatial filter)");
    putchar(10);
    puts("Note that it may be necessary to enclose the input file name");
    puts("in single quote characters on the Unix command line.");
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
    fitsfile *infptr, *outfptr;   /* FITS file pointers defined in fitsio.h */
    int status = 0;       /* status must always be initialized = 0  */

    if (argc != 3)
    {
 printf("Usage:  fitscopy inputfile outputfile\n");
 printf("\n");
 printf("Copy an input file to an output file, optionally filtering\n");
 printf("the file in the process.  This seemingly simple program can\n");
 printf("apply powerful filters which transform the input file as\n");
 printf("it is being copied.  Filters may be used to extract a\n");
 printf("subimage from a larger image, select rows from a table,\n");
 printf("filter a table with a GTI time extension or a SAO region file,\n");
 printf("create or delete columns in a table, create an image by\n");
 printf("binning (histogramming) 2 table columns, and convert IRAF\n");
 printf("format *.imh or raw binary data files into FITS images.\n");
 printf("See the CFITSIO User's Guide for a complete description of\n");
 printf("the Extended File Name filtering syntax.\n");
 printf("\n");
 printf("Examples:\n");
 printf("\n");
 printf("fitscopy in.fit out.fit                   (simple file copy)\n");
 printf("fitscopy - -                              (stdin to stdout)\n");
 printf("fitscopy in.fit[11:50,21:60] out.fit      (copy a subimage)\n");
 printf("fitscopy iniraf.imh out.fit               (IRAF image to FITS)\n");
 printf("fitscopy in.dat[i512,512] out.fit         (raw array to FITS)\n");
 printf("fitscopy in.fit[events][pi>35] out.fit    (copy rows with pi>35)\n");
 printf("fitscopy in.fit[events][bin X,Y] out.fit  (bin an image) \n");
 printf("fitscopy in.fit[events][col x=.9*y] out.fit        (new x column)\n");
 printf("fitscopy in.fit[events][gtifilter()] out.fit       (time filter)\n");
 printf("fitscopy in.fit[2][regfilter(\"pow.reg\")] out.fit (spatial filter)\n");
 printf("\n");
 printf("Note that it may be necessary to enclose the input file name\n");
 printf("in single quote characters on the Unix command line.\n");
      return(0);
    }
    /* Open the input file */
    if ( !fits_open_file(&infptr, argv[1], READONLY, &status) )
    {
      /* Create the output file */
      if ( !fits_create_file(&outfptr, argv[2], &status) )
      {
 
        /* copy the previous, current, and following HDUs */
        fits_copy_file(infptr, outfptr, 1, 1, 1, &status);

        fits_close_file(outfptr,  &status);
      }
      fits_close_file(infptr, &status);
    }

    /* if error occured, print out error message */
    if (status) fits_report_error(stderr, status);
    return(status);
}